

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefixOut)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  xmlChar *pxVar7;
  size_t __n;
  xmlChar *pxVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  xmlChar *pxVar14;
  int l;
  xmlChar buf [105];
  int local_ac;
  byte local_a8 [120];
  
  if (prefixOut == (xmlChar **)0x0) {
    return (xmlChar *)0x0;
  }
  *prefixOut = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  bVar2 = *name;
  if (bVar2 == 0x3a) {
LAB_0013395f:
    pxVar7 = xmlStrdup(name);
    return pxVar7;
  }
  uVar11 = 0;
  while ((bVar2 != 0 && (bVar2 != 0x3a))) {
    if (uVar11 == 100) {
      __n = 100;
      goto LAB_001339cf;
    }
    local_a8[uVar11] = bVar2;
    lVar1 = uVar11 + 1;
    uVar11 = uVar11 + 1;
    bVar2 = name[lVar1];
  }
  if (uVar11 < 100) {
    pbVar12 = name + uVar11 + 1;
    uVar13 = 100;
    pxVar7 = (xmlChar *)0x0;
  }
  else {
    __n = uVar11 & 0xffffffff;
LAB_001339cf:
    uVar13 = (ulong)(uint)((int)__n * 2);
    pxVar7 = (xmlChar *)(*xmlMalloc)(uVar13);
    if (pxVar7 == (xmlChar *)0x0) goto LAB_00133b78;
    memcpy(pxVar7,local_a8,__n);
    pbVar12 = name + uVar11 + 1;
    while ((bVar2 != 0 && (bVar2 != 0x3a))) {
      uVar5 = (uint)uVar13;
      pxVar8 = pxVar7;
      if ((int)uVar5 < (int)__n + 10) {
        if ((int)uVar5 < 1) {
          uVar13 = 1;
        }
        else {
          if (999999999 < uVar5) goto LAB_00133d3a;
          uVar3 = uVar5 + 1 >> 1;
          uVar4 = uVar3 + uVar5;
          if (1000000000 - uVar3 < uVar5) {
            uVar4 = 1000000000;
          }
          uVar13 = (ulong)uVar4;
        }
        pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,uVar13);
        if (pxVar8 == (xmlChar *)0x0) goto LAB_00133d3a;
      }
      pxVar8[__n] = bVar2;
      __n = __n + 1;
      bVar2 = *pbVar12;
      pbVar12 = pbVar12 + 1;
      pxVar7 = pxVar8;
    }
    pxVar7[__n & 0xffffffff] = '\0';
    uVar11 = __n;
  }
  if ((bVar2 == 0x3a) && (*pbVar12 == 0)) {
    if (pxVar7 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar7);
    }
    goto LAB_0013395f;
  }
  uVar9 = 100;
  if ((pxVar7 == (xmlChar *)0x0) &&
     (pxVar7 = xmlStrndup(local_a8,(int)uVar11), uVar9 = uVar13, pxVar7 == (xmlChar *)0x0)) {
LAB_00133b78:
    xmlCtxtErrMemory(ctxt);
    return (xmlChar *)0x0;
  }
  if (bVar2 != 0x3a) {
    return pxVar7;
  }
  bVar2 = *pbVar12;
  if (bVar2 == 0) {
    pxVar8 = xmlStrndup("",0);
joined_r0x00133bb2:
    if (pxVar8 != (xmlChar *)0x0) goto LAB_00133d75;
  }
  else {
    if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x3a)) && (bVar2 != 0x5f)) {
      uVar5 = xmlStringCurrentChar(ctxt,pbVar12,&local_ac);
      if ((int)uVar5 < 0x100) {
        if ((((0x16 < uVar5 - 0xc0) && ((0x19 < (uVar5 & 0xffffffdf) - 0x41 && (uVar5 != 0x5f)))) &&
            ((int)uVar5 < 0xf8)) && (0x1e < uVar5 - 0xd8)) {
LAB_00133c00:
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_NS_ERR_QNAME,XML_ERR_FATAL,name,
                     (xmlChar *)0x0,(xmlChar *)0x0,0,"Name %s is not XML Namespace compliant\n",name
                    );
        }
      }
      else {
        iVar6 = xmlCharInRange(uVar5,&xmlIsBaseCharGroup);
        if ((iVar6 == 0) &&
           ((uVar5 - 0x302a < 0xfffffff7 && uVar5 - 0x9fa6 < 0xffffae5a) && uVar5 != 0x3007))
        goto LAB_00133c00;
      }
    }
    pbVar12 = pbVar12 + 1;
    if ((int)uVar9 < 1) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        local_a8[uVar11] = bVar2;
        bVar2 = pbVar12[uVar11];
        uVar11 = uVar11 + 1;
        if (bVar2 == 0) break;
      } while (uVar11 < uVar9);
      if (uVar11 < uVar9) {
        pxVar8 = xmlStrndup(local_a8,(int)uVar11);
        goto joined_r0x00133bb2;
      }
      pbVar12 = pbVar12 + uVar11;
    }
    sVar10 = (size_t)(uint)((int)uVar11 * 2);
    pxVar8 = (xmlChar *)(*xmlMalloc)(sVar10);
    if (pxVar8 != (xmlChar *)0x0) {
      uVar11 = uVar11 & 0xffffffff;
      memcpy(pxVar8,local_a8,uVar11);
      pxVar14 = pxVar8;
      if (bVar2 != 0) {
        do {
          uVar5 = (uint)sVar10;
          pxVar8 = pxVar14;
          if ((int)uVar5 < (int)uVar11 + 10) {
            if ((int)uVar5 < 1) {
              sVar10 = 1;
            }
            else {
              if (999999999 < uVar5) {
                xmlCtxtErrMemory(ctxt);
                pxVar7 = pxVar14;
                goto LAB_00133d4e;
              }
              uVar3 = uVar5 + 1 >> 1;
              uVar4 = uVar3 + uVar5;
              if (1000000000 - uVar3 < uVar5) {
                uVar4 = 1000000000;
              }
              sVar10 = (size_t)uVar4;
            }
            pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar14,sVar10);
            if (pxVar8 == (xmlChar *)0x0) {
              xmlCtxtErrMemory(ctxt);
              (*xmlFree)(pxVar7);
              (*xmlFree)(pxVar14);
              return (xmlChar *)0x0;
            }
          }
          pxVar8[uVar11] = bVar2;
          uVar11 = uVar11 + 1;
          bVar2 = *pbVar12;
          pbVar12 = pbVar12 + 1;
          pxVar14 = pxVar8;
        } while (bVar2 != 0);
        uVar11 = uVar11 & 0xffffffff;
      }
      pxVar8[uVar11] = '\0';
LAB_00133d75:
      *prefixOut = pxVar7;
      return pxVar8;
    }
LAB_00133d3a:
    xmlCtxtErrMemory(ctxt);
  }
LAB_00133d4e:
  (*xmlFree)(pxVar7);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefixOut) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    xmlChar *prefix;
    const xmlChar *cur = name;
    int c;

    if (prefixOut == NULL) return(NULL);
    *prefixOut = NULL;

    if (cur == NULL) return(NULL);

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = xmlMalloc(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
                }
		tmp = xmlRealloc(buffer, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
		}
		buffer = tmp;
		max = newSize;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	return(xmlStrdup(name));
    }

    if (buffer == NULL) {
	ret = xmlStrndup(buf, len);
        if (ret == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
        }
    } else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        prefix = ret;
	if (c == 0) {
	    ret = xmlStrndup(BAD_CAST "", 0);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
            *prefixOut = prefix;
            return(ret);
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
                xmlFree(prefix);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                    if (newSize < 0) {
                        xmlErrMemory(ctxt);
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
                        xmlFree(prefix);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL) {
	    ret = xmlStrndup(buf, len);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
	} else {
	    ret = buffer;
	}

        *prefixOut = prefix;
    }

    return(ret);
}